

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionObjectStore.cpp
# Opt level: O3

void __thiscall
SessionObjectStore::getObjects
          (SessionObjectStore *this,CK_SLOT_ID slotID,
          set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *inObjects)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  MutexLocker lock;
  OSObject *local_40;
  MutexLocker local_38;
  
  MutexLocker::MutexLocker(&local_38,this->storeMutex);
  p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      bVar1 = SessionObject::hasSlotID(*(SessionObject **)(p_Var2 + 1),slotID);
      if (bVar1) {
        local_40 = *(OSObject **)(p_Var2 + 1);
        std::
        _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
        ::_M_insert_unique<OSObject*>
                  ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                    *)inObjects,&local_40);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  MutexLocker::~MutexLocker(&local_38);
  return;
}

Assistant:

void SessionObjectStore::getObjects(CK_SLOT_ID slotID, std::set<OSObject*> &inObjects)
{
	// Make sure that no other thread is in the process of changing
	// the object list when we return it
	MutexLocker lock(storeMutex);

	std::set<SessionObject*>::iterator it;
	for (it=objects.begin(); it!=objects.end(); ++it) {
		if ((*it)->hasSlotID(slotID))
			inObjects.insert(*it);
	}
}